

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void do_note_off(_mdi *mdi,_event_data *data)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  _note *nte;
  uint in_EDX;
  uchar ch;
  
  uVar1 = (uint)data & 0xff;
  uVar3 = (ulong)((in_EDX >> 8) * 0x50);
  lVar2 = uVar3 + uVar1 * 0x2800;
  nte = (_note *)((long)&mdi->note_table[0][0][0].noteid + uVar3 + uVar1 * 0x2800);
  if ((&mdi->note_table[0][0][0].active)[lVar2] == '\0') {
    nte = (_note *)((long)&mdi->note_table[1][0][0].noteid + lVar2);
  }
  if ((nte->active != '\0') &&
     (((&mdi->channel[0].isdrum)[uVar1 * 0x30] == '\0' || ((nte->modes & 4) != 0)))) {
    if (((nte->modes & 0x40) != 0) && (nte->env == '\0')) {
      nte->is_off = '\x01';
      return;
    }
    do_note_off_extra(nte);
    return;
  }
  return;
}

Assistant:

static void do_note_off(struct _mdi *mdi, struct _event_data *data) {
	struct _note *nte;
	unsigned char ch = data->channel;

	MIDI_EVENT_DEBUG(__FUNCTION__,ch);

	nte = &mdi->note_table[0][ch][(data->data >> 8)];
	if (!nte->active)
		nte = &mdi->note_table[1][ch][(data->data >> 8)];
	if (!nte->active) {
		return;
	}

	if ((mdi->channel[ch].isdrum) && (!(nte->modes & SAMPLE_LOOP))) {
		return;
	}

	if ((nte->modes & SAMPLE_ENVELOPE) && (nte->env == 0)) {
		// This is a fix for notes that end before the
		// initial step of the envelope has completed
		// making it impossible to hear them at times.
		nte->is_off = 1;
	} else {
		do_note_off_extra(nte);
	}
}